

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

void __thiscall cmCTestP4::DescribeParser::DoDiffLine(DescribeParser *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  string action;
  string Path;
  Change change;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  char *local_68;
  ulong local_60;
  char local_58;
  undefined7 uStack_57;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexDiff,(this->super_LineParser).Line._M_dataplus._M_p);
  if (bVar2) {
    local_48[0] = '?';
    local_38 = 0;
    local_30._M_local_buf[0] = '\0';
    pcVar1 = (this->RegexDiff).startp[1];
    local_68 = &local_58;
    local_40._M_p = (pointer)&local_30;
    if (pcVar1 == (char *)0x0) {
      local_60 = 0;
      local_58 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,pcVar1,(this->RegexDiff).endp[1]);
    }
    if ((((2 < local_60) && (*local_68 == '/')) && (local_68[1] == '/')) &&
       (lVar4 = std::__cxx11::string::find((char)&local_68,0x2f), lVar4 != -1)) {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_68);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
    }
    std::__cxx11::string::_M_assign((string *)&local_40);
    pcVar1 = (this->RegexDiff).startp[2];
    if (pcVar1 == (char *)0x0) {
      local_88 = &local_78;
      local_80 = 0;
      local_78 = 0;
    }
    else {
      local_88 = &local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,pcVar1,(this->RegexDiff).endp[2]);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar3 == 0) {
      local_48[0] = 'A';
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar3 == 0) {
        local_48[0] = 'D';
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_88);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_88), iVar3 == 0))
        {
          local_48[0] = 'M';
        }
      }
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,(value_type *)local_48);
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,
                      CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]) + 1);
    }
    return;
  }
  return;
}

Assistant:

void DoDiffLine()
  {
    if (this->RegexDiff.find(this->Line)) {
      Change change;
      std::string Path = this->RegexDiff.match(1);
      if (Path.length() > 2 && Path[0] == '/' && Path[1] == '/') {
        size_t found = Path.find('/', 2);
        if (found != std::string::npos) {
          Path = Path.substr(found + 1);
        }
      }

      change.Path = Path;
      std::string action = this->RegexDiff.match(2);

      if (action == "add") {
        change.Action = 'A';
      } else if (action == "delete") {
        change.Action = 'D';
      } else if (action == "edit" || action == "integrate") {
        change.Action = 'M';
      }

      Changes.push_back(change);
    }
  }